

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedirectHandlers.cpp
# Opt level: O1

InputSource * __thiscall
RedirectHandlers::resolveEntity(RedirectHandlers *this,XMLCh *param_1,XMLCh *systemId)

{
  int iVar1;
  LocalFileInputSource *this_00;
  
  iVar1 = xercesc_4_0::XMLString::compareString(L"personal.dtd",systemId);
  if (iVar1 == 0) {
    this_00 = (LocalFileInputSource *)
              xercesc_4_0::XMemory::operator_new((XMemory *)0x30,(ulong)systemId);
    xercesc_4_0::LocalFileInputSource::LocalFileInputSource
              (this_00,L"redirect.dtd",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  else {
    this_00 = (LocalFileInputSource *)0x0;
  }
  return (InputSource *)this_00;
}

Assistant:

InputSource* RedirectHandlers::resolveEntity(const   XMLCh* const    /* publicId */
                                             , const XMLCh* const    systemId)
{
    //
    //  If it's our file, then create a new URL input source for the file that
    //  we want to really be used. Otherwise, just return NULL to let the
    //  default action occur.
    if (XMLString::compareString(gFileToTrap, systemId) != 0)
    {
        return NULL;
    }
    else
    {
        // They were equal, so redirect to our other file
        return new LocalFileInputSource(gRedirectToFile);
    }
}